

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O1

double betainv(double alpha,double p,double q)

{
  undefined1 auVar1 [16];
  char *__format;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ulong uVar8;
  ulong extraout_XMM0_Qb;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double b;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  ulong local_58;
  ulong uStack_50;
  double local_38;
  
  dVar4 = beta_log(p,q);
  if ((p < 0.0) || (q < 0.0)) {
    __format = "parameters should be non-negatve and real";
  }
  else {
    if ((0.0 <= alpha) && (alpha <= 1.0)) {
      if ((alpha == 0.0) && (!NAN(alpha))) {
        return 0.0;
      }
      if ((alpha == 1.0) && (!NAN(alpha))) {
        return 1.0;
      }
      uVar2 = -(ulong)(alpha <= 0.5);
      local_38 = p;
      if (0.5 < alpha) {
        alpha = 1.0 - alpha;
        local_38 = q;
      }
      b = (double)(~uVar2 & (ulong)p | uVar2 & (ulong)q);
      dVar5 = log(alpha * alpha);
      if (-0.0 < dVar5) {
        dVar5 = sqrt(-dVar5);
      }
      else {
        dVar5 = SQRT(-dVar5);
      }
      dVar5 = dVar5 - (dVar5 * 0.27061 + 2.30753) / ((dVar5 * 0.04481 + 0.99229) * dVar5 + 1.0);
      if ((local_38 <= 1.0) || (b <= 1.0)) {
        dVar7 = 1.0 / (b * 9.0);
        if (dVar7 < 0.0) {
          dVar6 = sqrt(dVar7);
        }
        else {
          dVar6 = SQRT(dVar7);
        }
        dVar5 = pow(dVar5 * dVar6 + (1.0 - dVar7),3.0);
        dVar5 = dVar5 * (b + b);
        if (dVar5 <= 0.0) {
          dVar5 = log((1.0 - alpha) * b);
          dVar5 = exp((dVar5 + dVar4) / b);
          dVar5 = 1.0 - dVar5;
        }
        else {
          dVar5 = (local_38 * 4.0 + b + b + -2.0) / dVar5;
          if (dVar5 <= 1.0) {
            dVar5 = log(alpha * local_38);
            dVar5 = exp((dVar5 + dVar4) / local_38);
          }
          else {
            dVar5 = -2.0 / (dVar5 + 1.0) + 1.0;
          }
        }
      }
      else {
        dVar7 = (dVar5 * dVar5 + -3.0) / 6.0;
        dVar13 = 1.0 / (local_38 + local_38 + -1.0);
        dVar12 = 1.0 / (b + b + -1.0);
        dVar11 = 2.0 / (dVar13 + dVar12);
        dVar6 = dVar11 + dVar7;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        dVar5 = (dVar5 * dVar6) / dVar11 -
                (-2.0 / (dVar11 * 3.0) + dVar7 + 0.8333333333333334) * (dVar12 - dVar13);
        dVar5 = exp(dVar5 + dVar5);
        dVar5 = local_38 / (dVar5 * b + local_38);
      }
      uVar9 = 0xeb1c432d;
      uVar10 = 0x3f1a36e2;
      if (0.0001 <= dVar5) {
        uVar9 = SUB84(dVar5,0);
        uVar10 = (undefined4)((ulong)dVar5 >> 0x20);
      }
      dVar5 = 0.9999;
      if ((double)CONCAT44(uVar10,uVar9) <= 0.9999) {
        dVar5 = (double)CONCAT44(uVar10,uVar9);
      }
      dVar7 = pow(alpha,0.2);
      dVar7 = ((-5.0 / local_38) / local_38 - 1.0 / dVar7) + -13.0;
      if (dVar7 <= -37.0) {
        dVar7 = -37.0;
      }
      dVar11 = pow(10.0,(double)(int)dVar7);
      auVar14 = ZEXT816(0x3ff0000000000000);
      dVar7 = 1.0;
      uVar8 = 0;
      dVar6 = 0.0;
LAB_0013bf5d:
      dVar12 = dVar5;
      dVar5 = ibeta(dVar12,local_38,b);
      uVar9 = 0;
      uVar10 = 0x3ff00000;
      if (dVar5 <= 1.0) {
        uVar9 = SUB84(dVar5,0);
        uVar10 = (undefined4)((ulong)dVar5 >> 0x20);
      }
      dVar5 = log(dVar12);
      dVar13 = log(1.0 - dVar12);
      dVar13 = exp(dVar13 * (1.0 - b) + dVar5 * (1.0 - local_38) + dVar4);
      local_58 = auVar14._0_8_;
      uStack_50 = auVar14._8_8_;
      dVar13 = dVar13 * ((double)CONCAT44(uVar10,uVar9) - alpha);
      if (dVar7 <= 1e-37) {
        dVar7 = 1e-37;
      }
      uVar3 = -(ulong)(0.0 < dVar6 * dVar13);
      auVar14._0_8_ = local_58 & uVar3;
      auVar14._8_8_ = uStack_50 & uVar8;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = ~uVar3 & (ulong)dVar7;
      auVar14 = auVar14 | auVar1;
      dVar6 = 1.0;
      do {
        dVar5 = dVar13 * dVar6;
        dVar7 = dVar5 * dVar5;
        if (((dVar7 < auVar14._0_8_) && (dVar5 = dVar12 - dVar5, 0.0 <= dVar5)) && (dVar5 <= 1.0)) {
          if ((auVar14._0_8_ <= dVar11) || (dVar13 * dVar13 <= dVar11)) goto LAB_0013c0d2;
          if (((dVar5 != 0.0) || (NAN(dVar5))) && ((dVar5 != 1.0 || (NAN(dVar5)))))
          goto LAB_0013c0a3;
        }
        dVar6 = dVar6 / 3.0;
      } while( true );
    }
    __format = "probability values must lie between 0 and 1";
  }
  printf(__format);
  exit(1);
LAB_0013c0a3:
  dVar6 = dVar13;
  uVar8 = extraout_XMM0_Qb;
  if ((dVar5 == dVar12) && (!NAN(dVar5) && !NAN(dVar12))) {
LAB_0013c0d2:
    return (double)(~uVar2 & (ulong)(1.0 - dVar12) | (ulong)dVar12 & uVar2);
  }
  goto LAB_0013bf5d;
}

Assistant:

double betainv(double alpha, double p, double q) {
	/*
	 *   Author:

    Original FORTRAN77 version by GW Cran, KJ Martin, GE Thomas.
    C version by John Burkardt. 
    * 
    * Slightly modified to fit the rest of the code. (June 17 2013)
     
    Licensing:

    This code is distributed under the GNU LGPL license. 

    Reference:

    GW Cran, KJ Martin, GE Thomas,
    Remark AS R19 and Algorithm AS 109:
    A Remark on Algorithms AS 63: The Incomplete Beta Integral
    and AS 64: Inverse of the Incomplete Beta Integeral,
    Applied Statistics,
    Volume 26, Number 1, 1977, pages 111-114.
	 */ 
	 
  double a;
  double acu;
  double adj;
  double fpu;
  double g;
  double h;
  int iex;
  int indx;
  double pp;
  double prev;
  double qq;
  double r;
  double s;
  double sae = -37.0;
  double sq;
  double t;
  double tx;
  double value;
  double w;
  double xin;
  double y;
  double yprev;
  
  double beta;
 
  beta = beta_log(p,q);

  fpu = pow ( 10.0, sae );
  value = alpha;
  
    if ( p < 0.0 || q < 0.0 )
  {
    printf("parameters should be non-negatve and real");
    exit(1);
    
  }
  
    if ( alpha < 0.0 || 1.0 < alpha )
  {
	printf("probability values must lie between 0 and 1");
    exit(1);
  }
  
    if ( alpha == 0.0 )
  {
    value = 0.0;
    return value;
  }

  if ( alpha == 1.0 )
  {
    value = 1.0;
    return value;
  }
  

  if ( 0.5 < alpha )
  {
    a = 1.0 - alpha;
    pp = q;
    qq = p;
    indx = 1;
  }
  else
  {
    a = alpha;
    pp = p;
    qq = q;
    indx = 0;
  }

// initial approximation

  r = sqrt ( - log ( a * a ) );

  y = r - ( 2.30753 + 0.27061 * r ) 
    / ( 1.0 + ( 0.99229 + 0.04481 * r ) * r );

  if ( 1.0 < pp && 1.0 < qq )
  {
    r = ( y * y - 3.0 ) / 6.0;
    s = 1.0 / ( pp + pp - 1.0 );
    t = 1.0 / ( qq + qq - 1.0 );
    h = 2.0 / ( s + t );
    w = y * sqrt ( h + r ) / h - ( t - s ) 
      * ( r + 5.0 / 6.0 - 2.0 / ( 3.0 * h ) );
    value = pp / ( pp + qq * exp ( w + w ) );
  }
  else
  {
    r = qq + qq;
    t = 1.0 / ( 9.0 * qq );
    t = r * pow ( 1.0 - t + y * sqrt ( t ), 3 );

    if ( t <= 0.0 )
    {
      value = 1.0 - exp ( ( log ( ( 1.0 - a ) * qq ) + beta ) / qq );
    }
    else
    {
      t = ( 4.0 * pp + r - 2.0 ) / t;

      if ( t <= 1.0 )
      {
        value = exp ( ( log ( a * pp ) + beta ) / pp );
      }
      else
      {
        value = 1.0 - 2.0 / ( t + 1.0 );
      }
    }
  }

//Modified Newton-Raphson method
  r = 1.0 - pp;
  t = 1.0 - qq;
  yprev = 0.0;
  sq = 1.0;
  prev = 1.0;

  if ( value < 0.0001 )
  {
    value = 0.0001;
  }

  if ( 0.9999 < value )
  {
    value = 0.9999;
  }

  iex = (int) r8_max ( - 5.0 / pp / pp - 1.0 / pow ( a, 0.2 ) - 13.0, sae );

  acu = pow ( 10.0, iex );

  for ( ; ; )
  {
    y = betacdf( value, pp, qq);

    xin = value;
    y = ( y - a ) * exp ( beta + r * log ( xin ) + t * log ( 1.0 - xin ) );

    if ( y * yprev <= 0.0 )
    {
      prev = r8_max ( sq, fpu );
    }

    g = 1.0;

    for ( ; ; )
    {
      for ( ; ; )
      {
        adj = g * y;
        sq = adj * adj;

        if ( sq < prev )
        {
          tx = value - adj;

          if ( 0.0 <= tx && tx <= 1.0 )
          {
            break;
          }
        }
        g = g / 3.0;
      }

      if ( prev <= acu )
      {
        if ( indx )
        {
          value = 1.0 - value;
        }
        return value;
      }

      if ( y * y <= acu )
      {
        if ( indx )
        {
          value = 1.0 - value;
        }
        return value;
      }

      if ( tx != 0.0 && tx != 1.0 )
      {
        break;
      }

      g = g / 3.0;
    }

    if ( tx == value )
    {
      break;
    }

    value = tx;
    yprev = y;
  }

  if ( indx )
  {
    value = 1.0 - value;
  }

	return value;	
}